

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall gui::Timer::setCallback(Timer *this,function<void_(gui::Timer_*)> *callback)

{
  function<void_(gui::Timer_*)> local_60;
  Callback<gui::Timer_*> local_40;
  
  std::function<void_(gui::Timer_*)>::function(&local_60,callback);
  Callback<gui::Timer_*>::Callback(&local_40,&local_60);
  swap(&this->callback_,&local_40);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  return;
}

Assistant:

void Timer::setCallback(const std::function<void(Timer*)>& callback) {
    callback_ = callback;
}